

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_function_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  BOOL BVar2;
  JSContext *in_RSI;
  JSValue JVar3;
  char *suff;
  char *pref;
  JSValue name;
  JSFunctionBytecode *b;
  JSFunctionKindEnum func_kind;
  JSObject *p;
  undefined1 in_stack_00000098 [16];
  BOOL in_stack_00000120;
  JSAtom in_stack_ffffffffffffff2c;
  JSContext *in_stack_ffffffffffffff30;
  JSContext *in_stack_ffffffffffffff38;
  JSValue in_stack_ffffffffffffff40;
  JSContext *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar4;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion local_10;
  char *local_8;
  
  uVar4 = 0;
  iVar1 = check_function(in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  if (iVar1 == 0) {
    BVar2 = js_class_has_bytecode((uint)(in_RSI->header).dummy2);
    if (BVar2 != 0) {
      in_stack_ffffffffffffff80 = *(JSContext **)&in_RSI->binary_object_count;
      if ((((byte)((ushort)*(undefined2 *)((long)&in_stack_ffffffffffffff80->rt + 1) >> 10) & 1) !=
           0) && ((in_stack_ffffffffffffff80->regexp_ctor).u.ptr != (void *)0x0)) {
        JVar3 = JS_NewStringLen(in_RSI,(char *)CONCAT44(uVar4,in_stack_ffffffffffffff88),
                                (size_t)in_stack_ffffffffffffff80);
        return JVar3;
      }
      uVar4 = (uint)((byte)(*(ushort *)((long)&in_stack_ffffffffffffff80->rt + 1) >> 4) & 3);
    }
    switch(uVar4) {
    default:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
    }
    JVar3 = JS_GetPropertyInternal(ctx,(JSValue)in_stack_00000098,argc,this_val,in_stack_00000120);
    local_10 = JVar3.u;
    local_8 = (char *)JVar3.tag;
    iVar1 = JS_IsUndefined(JVar3);
    if (iVar1 != 0) {
      JVar3 = JS_AtomToString(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      local_10 = JVar3.u;
      local_8 = (char *)JVar3.tag;
    }
    JVar3.u._4_4_ = uVar4;
    JVar3.u.int32 = in_stack_ffffffffffffff88;
    JVar3.tag = (int64_t)in_RSI;
    _local_40 = JS_ConcatString3(in_stack_ffffffffffffff80,local_8,JVar3,(char *)local_10.ptr);
  }
  else {
    local_40.ptr = (void *)(local_40 << 0x20);
    local_38 = 6;
  }
  return _local_40;
}

Assistant:

static JSValue js_function_toString(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionKindEnum func_kind = JS_FUNC_NORMAL;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(this_val);
    if (js_class_has_bytecode(p->class_id)) {
        JSFunctionBytecode *b = p->u.func.function_bytecode;
        if (b->has_debug && b->debug.source) {
            return JS_NewStringLen(ctx, b->debug.source, b->debug.source_len);
        }
        func_kind = b->func_kind;
    }
    {
        JSValue name;
        const char *pref, *suff;

        switch(func_kind) {
        default:
        case JS_FUNC_NORMAL:
            pref = "function ";
            break;
        case JS_FUNC_GENERATOR:
            pref = "function *";
            break;
        case JS_FUNC_ASYNC:
            pref = "async function ";
            break;
        case JS_FUNC_ASYNC_GENERATOR:
            pref = "async function *";
            break;
        }
        suff = "() {\n    [native code]\n}";
        name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
        if (JS_IsUndefined(name))
            name = JS_AtomToString(ctx, JS_ATOM_empty_string);
        return JS_ConcatString3(ctx, pref, name, suff);
    }
}